

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O0

ALenum GetOpenALFormat(uint8_t channels)

{
  uint8_t channels_local;
  undefined4 local_4;
  
  if (channels == '\x01') {
    local_4 = 0x1101;
  }
  else if (channels == '\x02') {
    local_4 = 0x1103;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ALenum GetOpenALFormat(uint8_t channels) {
    switch (channels) {
        case 1:
            return AL_FORMAT_MONO16;
        case 2:
            return AL_FORMAT_STEREO16;
        default:
            return 0;
    }
}